

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedFieldRef<proto2_unittest::TestAllTypes,_void>::RepeatedFieldRef
          (RepeatedFieldRef<proto2_unittest::TestAllTypes,_void> *this,
          MakeDependent<proto2_unittest::TestAllTypes,_Message> *message,FieldDescriptor *field)

{
  int iVar1;
  void *pvVar2;
  RepeatedFieldAccessor *pRVar3;
  MessageFactory *pMVar4;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  Reflection *this_00;
  Metadata MVar6;
  
  MVar6 = Message::GetMetadata(message);
  this_00 = MVar6.reflection;
  MVar6 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  pvVar2 = Reflection::RepeatedFieldData(this_00,message,field,CPPTYPE_MESSAGE,MVar6.descriptor);
  this->data_ = pvVar2;
  pRVar3 = Reflection::RepeatedFieldAccessor(this_00,field);
  this->accessor_ = pRVar3;
  pMVar4 = Reflection::GetMessageFactory(this_00);
  pDVar5 = FieldDescriptor::message_type(field);
  iVar1 = (*pMVar4->_vptr_MessageFactory[2])(pMVar4,pDVar5);
  this->default_instance_ = (TestAllTypes *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

RepeatedFieldRef(const MakeDependent<T, Message>& message,
                   const FieldDescriptor* PROTOBUF_NONNULL field) {
    const auto* reflection = message.GetReflection();
    data_ = reflection->RepeatedFieldData(
        message, field, internal::RefTypeTraits<T>::cpp_type,
        internal::RefTypeTraits<T>::GetMessageFieldDescriptor());
    accessor_ = reflection->RepeatedFieldAccessor(field);
    default_instance_ = static_cast<const T*>(
        reflection->GetMessageFactory()->GetPrototype(field->message_type()));
  }